

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O0

int LZ4_compressHC_continue_generic
              (LZ4_streamHC_t *LZ4_streamHCPtr,char *src,char *dst,int *srcSizePtr,int dstCapacity,
              limitedOutput_directive limit)

{
  int iVar1;
  int *src_00;
  int *dst_00;
  int *srcSizePtr_00;
  int *in_RCX;
  int *in_RSI;
  long in_RDI;
  int in_R9D;
  BYTE *dictEnd;
  BYTE *dictBegin;
  BYTE *sourceEnd;
  size_t dictSize;
  LZ4HC_CCtx_internal *ctxPtr;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  LZ4HC_CCtx_internal *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  LZ4_streamHC_t *in_stack_ffffffffffffffc0;
  LZ4HC_CCtx_internal *in_stack_ffffffffffffffc8;
  
  if (*(long *)(in_RDI + 0x40008) == 0) {
    LZ4HC_init_internal(in_stack_ffffffffffffffb0,
                        (BYTE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  if (0x80000000 < (ulong)(*(long *)(in_RDI + 0x40000) - *(long *)(in_RDI + 0x40008))) {
    in_stack_ffffffffffffffc8 =
         (LZ4HC_CCtx_internal *)
         ((*(long *)(in_RDI + 0x40000) - *(long *)(in_RDI + 0x40008)) -
         (ulong)*(uint *)(in_RDI + 0x40018));
    if ((LZ4HC_CCtx_internal *)0x10000 < in_stack_ffffffffffffffc8) {
      in_stack_ffffffffffffffc8 = (LZ4HC_CCtx_internal *)0x10000;
    }
    LZ4_loadDictHC(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                   (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  }
  if (in_RSI != *(int **)(in_RDI + 0x40000)) {
    LZ4HC_setExternalDict
              (in_stack_ffffffffffffffb0,
               (BYTE *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  src_00 = (int *)((long)in_RSI + (long)*in_RCX);
  dst_00 = (int *)(*(long *)(in_RDI + 0x40010) + (ulong)*(uint *)(in_RDI + 0x4001c));
  srcSizePtr_00 = (int *)(*(long *)(in_RDI + 0x40010) + (ulong)*(uint *)(in_RDI + 0x40018));
  if ((dst_00 < src_00) && (in_RSI < srcSizePtr_00)) {
    if (srcSizePtr_00 < src_00) {
      src_00 = srcSizePtr_00;
    }
    *(int *)(in_RDI + 0x4001c) = (int)src_00 - (int)*(undefined8 *)(in_RDI + 0x40010);
    if ((uint)(*(int *)(in_RDI + 0x40018) - *(int *)(in_RDI + 0x4001c)) < 4) {
      *(undefined4 *)(in_RDI + 0x4001c) = *(undefined4 *)(in_RDI + 0x40018);
    }
  }
  iVar1 = LZ4HC_compress_generic
                    (in_stack_ffffffffffffffc8,(char *)src_00,(char *)dst_00,srcSizePtr_00,
                     in_stack_ffffffffffffffac,in_R9D,(limitedOutput_directive)in_RCX);
  return iVar1;
}

Assistant:

static int
LZ4_compressHC_continue_generic (LZ4_streamHC_t* LZ4_streamHCPtr,
                                 const char* src, char* dst,
                                 int* srcSizePtr, int dstCapacity,
                                 limitedOutput_directive limit)
{
    LZ4HC_CCtx_internal* const ctxPtr = &LZ4_streamHCPtr->internal_donotuse;
    DEBUGLOG(5, "LZ4_compressHC_continue_generic(ctx=%p, src=%p, srcSize=%d, limit=%d)",
                LZ4_streamHCPtr, src, *srcSizePtr, limit);
    assert(ctxPtr != NULL);
    /* auto-init if forgotten */
    if (ctxPtr->base == NULL) LZ4HC_init_internal (ctxPtr, (const BYTE*) src);

    /* Check overflow */
    if ((size_t)(ctxPtr->end - ctxPtr->base) > 2 GB) {
        size_t dictSize = (size_t)(ctxPtr->end - ctxPtr->base) - ctxPtr->dictLimit;
        if (dictSize > 64 KB) dictSize = 64 KB;
        LZ4_loadDictHC(LZ4_streamHCPtr, (const char*)(ctxPtr->end) - dictSize, (int)dictSize);
    }

    /* Check if blocks follow each other */
    if ((const BYTE*)src != ctxPtr->end)
        LZ4HC_setExternalDict(ctxPtr, (const BYTE*)src);

    /* Check overlapping input/dictionary space */
    {   const BYTE* sourceEnd = (const BYTE*) src + *srcSizePtr;
        const BYTE* const dictBegin = ctxPtr->dictBase + ctxPtr->lowLimit;
        const BYTE* const dictEnd   = ctxPtr->dictBase + ctxPtr->dictLimit;
        if ((sourceEnd > dictBegin) && ((const BYTE*)src < dictEnd)) {
            if (sourceEnd > dictEnd) sourceEnd = dictEnd;
            ctxPtr->lowLimit = (U32)(sourceEnd - ctxPtr->dictBase);
            if (ctxPtr->dictLimit - ctxPtr->lowLimit < 4) ctxPtr->lowLimit = ctxPtr->dictLimit;
    }   }

    return LZ4HC_compress_generic (ctxPtr, src, dst, srcSizePtr, dstCapacity, ctxPtr->compressionLevel, limit);
}